

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

void soplex::LPFwriteSVector
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *p_svec,SPxOut *spxout,bool writeZeroCoefficients)

{
  bool bVar1;
  int iVar2;
  type_conflict5 tVar3;
  int iVar4;
  Verbosity VVar5;
  char *pcVar6;
  long lVar7;
  streamoff sVar8;
  ostream *in_RSI;
  SPxOut *in_R8;
  byte in_R9B;
  undefined1 auVar9 [16];
  Verbosity old_verbosity;
  Rational coeff;
  int j;
  longlong pos;
  int num_coeffs;
  char name [16];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffe08;
  SPxOut *in_stack_fffffffffffffe10;
  NameSet *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  ostream *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  byte local_151;
  undefined1 local_130 [16];
  undefined4 local_120;
  Verbosity local_11c;
  undefined1 local_118 [16];
  byte local_101;
  string local_100 [32];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined4 local_bc;
  int local_6c;
  fpos local_68 [16];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_58;
  int local_4c;
  byte local_29;
  SPxOut *local_28;
  ostream *local_10;
  
  local_29 = in_R9B & 1;
  local_4c = 0;
  local_28 = in_R8;
  local_10 = in_RSI;
  local_68 = (fpos  [16])std::ostream::tellp();
  local_58 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)std::fpos::operator_cast_to_long(local_68);
  local_6c = 0;
  while( true ) {
    iVar2 = local_6c;
    iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x1ae9de);
    if (iVar4 <= iVar2) break;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    local_bc = 0;
    tVar3 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffe18,(int *)in_stack_fffffffffffffe10);
    local_151 = 0;
    if (tVar3) {
      local_151 = local_29 ^ 0xff;
    }
    if ((local_151 & 1) == 0) {
      if (local_4c == 0) {
        in_stack_fffffffffffffea0 =
             boost::multiprecision::operator<<
                       (in_stack_fffffffffffffea0,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffffe98);
        in_stack_fffffffffffffe98 = std::operator<<(in_stack_fffffffffffffea0," ");
        pcVar6 = getColName((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
        std::operator<<(in_stack_fffffffffffffe98,pcVar6);
      }
      else {
        local_101 = 0;
        bVar1 = true;
        if (local_4c != 5) {
          auVar9 = std::ostream::tellp();
          local_e0 = auVar9;
          in_stack_fffffffffffffe70 = (ostream *)std::fpos::operator_cast_to_long((fpos *)local_e0);
          in_stack_fffffffffffffe68 = in_stack_fffffffffffffe70 + -(long)local_58;
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffffe18,(streamsize)in_stack_fffffffffffffe10,
                           (fmtflags)((ulong)in_stack_fffffffffffffe08 >> 0x20));
          local_101 = 1;
          lVar7 = std::__cxx11::string::length();
          bVar1 = 0x10000 < (long)(in_stack_fffffffffffffe68 + lVar7 + 100);
        }
        if ((local_101 & 1) != 0) {
          std::__cxx11::string::~string(local_100);
        }
        if (bVar1) {
          local_4c = 0;
          std::operator<<(local_10,"\n\t");
          auVar9 = std::ostream::tellp();
          local_118 = auVar9;
          sVar8 = std::fpos::operator_cast_to_long((fpos *)local_118);
          if ((0x10000 < sVar8 - (long)local_58) && (local_28 != (SPxOut *)0x0)) {
            VVar5 = SPxOut::getVerbosity(local_28);
            if (0 < (int)VVar5) {
              local_11c = SPxOut::getVerbosity(local_28);
              local_120 = 1;
              (*local_28->_vptr_SPxOut[2])(local_28,&local_120);
              operator<<(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
              (*local_28->_vptr_SPxOut[2])(local_28,&local_11c);
            }
          }
          auVar9 = std::ostream::tellp();
          local_130 = auVar9;
          in_stack_fffffffffffffe30 =
               (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)std::fpos::operator_cast_to_long((fpos *)local_130);
          local_58 = in_stack_fffffffffffffe30;
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffffe18,(int *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe2c = CONCAT13(tVar3,(int3)in_stack_fffffffffffffe2c);
        if (tVar3) {
          in_stack_fffffffffffffe20 = std::operator<<(local_10," - ");
          boost::multiprecision::operator-(in_stack_fffffffffffffe08);
          boost::multiprecision::detail::operator<<
                    (in_stack_fffffffffffffe70,
                     (expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                      *)in_stack_fffffffffffffe68);
        }
        else {
          in_stack_fffffffffffffe18 = (NameSet *)std::operator<<(local_10," + ");
          boost::multiprecision::operator<<
                    (in_stack_fffffffffffffea0,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffffe98);
        }
        in_stack_fffffffffffffe10 = (SPxOut *)std::operator<<(local_10," ");
        in_stack_fffffffffffffe08 =
             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              *)getColName((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe18
                           ,(char *)in_stack_fffffffffffffe10);
        std::operator<<((ostream *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
      }
      local_4c = local_4c + 1;
      local_d0 = 0;
    }
    else {
      local_d0 = 4;
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x1aeece);
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<Rational>&   p_lp,                         ///< the LP
   std::ostream&                p_output,                     ///< output stream
   const NameSet*               p_cnames,                     ///< column names
   const SVectorBase<Rational>& p_svec,                       ///< vector to write
   SPxOut*                      spxout,                       ///< out stream
   const bool                   writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;
   long long pos;

   pos = p_output.tellp();

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const Rational coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns or whenever max line length is nearly exceeded
         if(num_coeffs == SOPLEX_NUM_ENTRIES_PER_LINE ||
               (long long)(p_output.tellp()) - pos + (long long)(coeff.str().length() + 100) >
               SOPLEX_MAX_LINE_WRITE_LEN)
         {
            num_coeffs = 0;
            p_output << "\n\t";

            if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
            {
               SPX_MSG_WARNING((*spxout), (*spxout) <<
                               "XLPSWR01 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
            }

            pos = p_output.tellp();
         }

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}